

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O1

int ndn_asn1_probe_ecdsa_signature_encoding_size
              (uint8_t *raw_ecdsa_sig,uint32_t raw_ecdsa_sig_len,uint32_t *encoded_ecdsa_sig_len)

{
  uint32_t uVar1;
  int iVar2;
  uint8_t local_58 [8];
  uint8_t sig [72];
  
  iVar2 = -0x84;
  if (raw_ecdsa_sig_len == 0x40) {
    sig._0_8_ = *(undefined8 *)raw_ecdsa_sig;
    sig._8_8_ = *(undefined8 *)(raw_ecdsa_sig + 8);
    sig._16_8_ = *(undefined8 *)(raw_ecdsa_sig + 0x10);
    sig._24_8_ = *(undefined8 *)(raw_ecdsa_sig + 0x18);
    sig._32_8_ = *(undefined8 *)(raw_ecdsa_sig + 0x20);
    sig._40_8_ = *(undefined8 *)(raw_ecdsa_sig + 0x28);
    sig._48_8_ = *(undefined8 *)(raw_ecdsa_sig + 0x30);
    sig._56_8_ = *(undefined8 *)(raw_ecdsa_sig + 0x38);
    uVar1 = encodeSignatureBits(local_58);
    *encoded_ecdsa_sig_len = uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
ndn_asn1_probe_ecdsa_signature_encoding_size(const uint8_t *raw_ecdsa_sig, uint32_t raw_ecdsa_sig_len,
                                             uint32_t *encoded_ecdsa_sig_len)
{
  if (raw_ecdsa_sig_len != 64) {
    return NDN_ASN1_ECDSA_SIG_INVALID_SIZE;
  }
  uint8_t sig[72];
  memcpy(&sig[8], raw_ecdsa_sig, 64);
  *encoded_ecdsa_sig_len = (uint32_t)encodeSignatureBits(sig);
  return NDN_SUCCESS;
}